

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O0

DistanceGraph * __thiscall
LinkageUntangler::make_nextselected_linkage(LinkageUntangler *this,int min_links)

{
  Support support;
  Support support_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  pointer pvVar5;
  long lVar6;
  undefined8 *in_RSI;
  DistanceGraph *in_RDI;
  reference rVar7;
  reference rVar8;
  reference rVar9;
  pair<int,_long> *bwl;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *__range2_1;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  pair<int,_long> *fwl;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *__range2;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  int n;
  DistanceGraph *ldg;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *in_stack_fffffffffffffe48;
  __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  *in_stack_fffffffffffffe50;
  _Bit_type in_stack_fffffffffffffe60;
  _Bit_type *in_stack_fffffffffffffe68;
  uint7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  long in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  DistanceGraph *in_stack_fffffffffffffe90;
  _Bit_type *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  _Bit_type in_stack_fffffffffffffea8;
  _Bit_type *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  byte bVar10;
  Support local_110;
  reference local_100;
  reference local_f0;
  pair<int,_long> *local_e8;
  __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [24];
  Support local_b8;
  _Bit_type *in_stack_ffffffffffffff58;
  _Bit_type in_stack_ffffffffffffff60;
  reference rVar11;
  DistanceGraph *in_stack_ffffffffffffff68;
  __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  reference local_60;
  int local_50;
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  
  local_15 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"unnamed",&local_39);
  DistanceGraph::DistanceGraph
            (in_stack_fffffffffffffe90,
             (SequenceDistanceGraph *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  rVar11._M_mask = in_stack_ffffffffffffff60;
  rVar11._M_p = in_stack_ffffffffffffff58;
  rVar7._M_mask = in_stack_fffffffffffffea8;
  rVar7._M_p = in_stack_fffffffffffffeb0;
  rVar8._M_mask = (_Bit_type)in_stack_fffffffffffffe90;
  rVar8._M_p = in_stack_fffffffffffffe98;
  rVar9._M_mask = in_stack_fffffffffffffe60;
  rVar9._M_p = in_stack_fffffffffffffe68;
  local_50 = 1;
  do {
    uVar4 = (ulong)local_50;
    sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                      ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RSI + 0x40));
    if (sVar2 <= uVar4) {
      return in_RDI;
    }
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RSI + 0x40),
                        (long)local_50);
    bVar10 = 1;
    if (pvVar3->status != Deleted) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                         (size_type)rVar9._M_p);
      local_60 = rVar7;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_60);
      bVar10 = bVar1 ^ 0xff;
    }
    if ((bVar10 & 1) == 0) {
      DistanceGraph::fw_neighbours_by_distance
                (in_stack_ffffffffffffff68,rVar11._M_mask,rVar11._M_p._4_4_);
      local_80 = local_78;
      local_88._M_current =
           (pair<int,_long> *)
           std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::begin
                     (in_stack_fffffffffffffe48);
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::end
                (in_stack_fffffffffffffe48);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffe50,
                           (__normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                            *)in_stack_fffffffffffffe48);
        if (!bVar1) break;
        in_stack_ffffffffffffff68 =
             (DistanceGraph *)
             __gnu_cxx::
             __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
             ::operator*(&local_88);
        pvVar5 = (in_stack_ffffffffffffff68->links).
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pvVar5 < 1) {
          pvVar5 = (pointer)-(long)pvVar5;
        }
        in_stack_fffffffffffffea7 = false;
        if (pvVar5 != (pointer)(long)local_50) {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                             (size_type)rVar9._M_p);
          rVar11 = rVar8;
          in_stack_fffffffffffffea7 =
               std::_Bit_reference::operator_cast_to_bool
                         ((_Bit_reference *)&stack0xffffffffffffff58);
        }
        if ((bool)in_stack_fffffffffffffea7 != false) {
          bVar1 = DistanceGraph::are_connected
                            ((DistanceGraph *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             (sgNodeID_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe8c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
          if (!bVar1) {
            in_stack_fffffffffffffe78 = (long)-local_50;
            in_stack_fffffffffffffe80 =
                 (string *)
                 (in_stack_ffffffffffffff68->links).
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            in_stack_fffffffffffffe88 = *(int *)&in_stack_ffffffffffffff68->sdg;
            Support::Support(&local_b8,Undefined,0,0);
            support._7_1_ = bVar10;
            support.type = (char)in_stack_fffffffffffffeb8;
            support._1_1_ = (char)((uint7)in_stack_fffffffffffffeb8 >> 8);
            support.index = (short)((uint7)in_stack_fffffffffffffeb8 >> 0x10);
            support._4_3_ = (int3)((uint7)in_stack_fffffffffffffeb8 >> 0x20);
            support.id = uVar4;
            DistanceGraph::add_link
                      ((DistanceGraph *)rVar7._M_p,rVar7._M_mask,
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       rVar8._M_p._4_4_,support);
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
        ::operator++(&local_88);
      }
      DistanceGraph::fw_neighbours_by_distance
                (in_stack_ffffffffffffff68,rVar11._M_mask,rVar11._M_p._4_4_);
      local_d8 = local_d0;
      local_e0._M_current =
           (pair<int,_long> *)
           std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::begin
                     (in_stack_fffffffffffffe48);
      local_e8 = (pair<int,_long> *)
                 std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::end
                           (in_stack_fffffffffffffe48);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffe50,
                           (__normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                            *)in_stack_fffffffffffffe48);
        if (!bVar1) break;
        local_f0 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                   ::operator*(&local_e0);
        lVar6 = local_f0->second;
        if (lVar6 < 1) {
          lVar6 = -lVar6;
        }
        in_stack_fffffffffffffe77 = false;
        if (lVar6 != local_50) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)(ulong)in_stack_fffffffffffffe70
                             ,(size_type)rVar9._M_p);
          local_100 = rVar9;
          in_stack_fffffffffffffe77 = std::_Bit_reference::operator_cast_to_bool(&local_100);
        }
        if ((bool)in_stack_fffffffffffffe77 != false) {
          bVar1 = DistanceGraph::are_connected
                            ((DistanceGraph *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             (sgNodeID_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          if (!bVar1) {
            in_stack_fffffffffffffe48 =
                 (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 (long)local_50;
            in_stack_fffffffffffffe50 =
                 (__normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                  *)local_f0->second;
            Support::Support(&local_110,Undefined,0,0);
            support_00._7_1_ = bVar10;
            support_00.type = (char)in_stack_fffffffffffffeb8;
            support_00._1_1_ = (char)((uint7)in_stack_fffffffffffffeb8 >> 8);
            support_00.index = (short)((uint7)in_stack_fffffffffffffeb8 >> 0x10);
            support_00._4_3_ = (int3)((uint7)in_stack_fffffffffffffeb8 >> 0x20);
            support_00.id = uVar4;
            DistanceGraph::add_link
                      ((DistanceGraph *)rVar7._M_p,rVar7._M_mask,
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       rVar8._M_p._4_4_,support_00);
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_long>_*,_std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
        ::operator++(&local_e0);
      }
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~vector
                ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 rVar9._M_mask);
      std::vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~vector
                ((vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 rVar9._M_mask);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

DistanceGraph LinkageUntangler::make_nextselected_linkage(int min_links) {
    DistanceGraph ldg(dg.sdg);
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted or !selected_nodes[n]) continue;
        auto fw_sorted = dg.fw_neighbours_by_distance(n, min_links);
        for (auto &fwl:fw_sorted) {
            if (llabs(fwl.second)!=n and selected_nodes[llabs(fwl.second)]) {
                if (!ldg.are_connected(-n, fwl.second)) {
                    ldg.add_link(-n, fwl.second, fwl.first);
                }
                break;
            }
        }
        auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
        for (auto &bwl:bw_sorted) {
            if (llabs(bwl.second)!=n and selected_nodes[llabs(bwl.second)]) {
                if (!ldg.are_connected(n, bwl.second)) {
                    ldg.add_link(n, bwl.second, bwl.first);
                }
                break;
            }
        }
    }
    return ldg;
}